

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<vkb::detail::SurfaceSupportDetails> *
vkb::detail::query_surface_support_details(VkPhysicalDevice phys_device,VkSurfaceKHR surface)

{
  uint32_t uVar1;
  VkResult VVar2;
  long in_RDX;
  Result<vkb::detail::SurfaceSupportDetails> *in_RDI;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> formats;
  VkSurfaceCapabilitiesKHR capabilities;
  VkSurfaceKHR_T *local_108;
  VkPhysicalDevice_T *local_100;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_f8;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  VkImageUsageFlags local_88;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_80;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_68;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 local_2c;
  undefined8 uStack_24;
  VkImageUsageFlags local_1c;
  
  if (in_RDX == 0) {
    uVar1 = 0;
    (in_RDI->field_0).m_value.capabilities.minImageCount = 0;
LAB_0010902f:
    *(undefined8 **)((long)&in_RDI->field_0 + 8) = &surface_support_error_category;
    (in_RDI->field_0).m_value.capabilities.minImageExtent.width = uVar1;
    in_RDI->m_init = false;
    return in_RDI;
  }
  uVar1 = (*(code *)vulkan_functions()::v._232_8_)();
  if (uVar1 != 0) {
    (in_RDI->field_0).m_value.capabilities.minImageCount = 1;
    goto LAB_0010902f;
  }
  local_d8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  VVar2 = get_vector<VkSurfaceFormatKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkSurfaceFormatKHR*),VkPhysicalDevice_T*&,VkSurfaceKHR_T*&>
                    (&local_d8,
                     (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkSurfaceFormatKHR_ptr
                      **)(vulkan_functions()::v + 0xd8),&local_100,&local_108);
  if (VVar2 == VK_SUCCESS) {
    VVar2 = get_vector<VkPresentModeKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*),VkPhysicalDevice_T*&,VkSurfaceKHR_T*&>
                      (&local_f8,
                       (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                        **)(vulkan_functions()::v + 0xe0),&local_100,&local_108);
    if (VVar2 == VK_SUCCESS) {
      local_88 = local_1c;
      local_98 = local_2c;
      uStack_90 = uStack_24;
      local_a8 = local_3c;
      uStack_a0 = uStack_34;
      local_b8 = local_4c;
      uStack_b0 = uStack_44;
      std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
                (&local_80,&local_d8);
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector(&local_68,&local_f8);
      (in_RDI->field_0).m_value.capabilities.supportedUsageFlags = local_88;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x20) = local_98;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x28) = uStack_90;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = local_a8;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x18) = uStack_a0;
      *(undefined8 *)&in_RDI->field_0 = local_b8;
      *(undefined8 *)((long)&in_RDI->field_0 + 8) = uStack_b0;
      (in_RDI->field_0).m_value.formats.
      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_80.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (in_RDI->field_0).m_value.formats.
      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_80.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (in_RDI->field_0).m_value.formats.
      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_80.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_80.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_80.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_80.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->field_0).m_value.present_modes.
      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_68.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_start;
      (in_RDI->field_0).m_value.present_modes.
      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (in_RDI->field_0).m_value.present_modes.
      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_68.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->m_init = true;
      goto LAB_001090c1;
    }
    (in_RDI->field_0).m_value.capabilities.minImageCount = 3;
  }
  else {
    (in_RDI->field_0).m_value.capabilities.minImageCount = 2;
  }
  *(undefined8 **)((long)&in_RDI->field_0 + 8) = &surface_support_error_category;
  (in_RDI->field_0).m_error.vk_result = VVar2;
  in_RDI->m_init = false;
LAB_001090c1:
  if (local_f8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return in_RDI;
  }
  operator_delete(local_d8.
                  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)local_d8.
                        super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_d8.
                        super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return in_RDI;
}

Assistant:

Result<SurfaceSupportDetails> query_surface_support_details(VkPhysicalDevice phys_device, VkSurfaceKHR surface) {
    if (surface == VK_NULL_HANDLE) return make_error_code(SurfaceSupportError::surface_handle_null);

    VkSurfaceCapabilitiesKHR capabilities;
    VkResult res = detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR(phys_device, surface, &capabilities);
    if (res != VK_SUCCESS) {
        return { make_error_code(SurfaceSupportError::failed_get_surface_capabilities), res };
    }

    std::vector<VkSurfaceFormatKHR> formats;
    std::vector<VkPresentModeKHR> present_modes;

    auto formats_ret = detail::get_vector<VkSurfaceFormatKHR>(
        formats, detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceFormatsKHR, phys_device, surface);
    if (formats_ret != VK_SUCCESS)
        return { make_error_code(SurfaceSupportError::failed_enumerate_surface_formats), formats_ret };
    auto present_modes_ret = detail::get_vector<VkPresentModeKHR>(
        present_modes, detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfacePresentModesKHR, phys_device, surface);
    if (present_modes_ret != VK_SUCCESS)
        return { make_error_code(SurfaceSupportError::failed_enumerate_present_modes), present_modes_ret };

    return SurfaceSupportDetails{ capabilities, formats, present_modes };
}